

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::PrimitiveOneofFieldGenerator::GenerateMembers
          (PrimitiveOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  PrimitiveOneofFieldGenerator *this_local;
  
  WritePropertyDocComment
            (printer,(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
  io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : $default_value$; }\n  set {\n"
                    );
  if (((this->super_PrimitiveFieldGenerator).is_value_type & 1U) == 0) {
    io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.
                                variables_,
                       "    $oneof_name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.
                                variables_,"    $oneof_name$_ = value;\n");
  }
  io::Printer::Print(printer,&(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "    $oneof_name$Case_ = $oneof_property_name$OneofCase.$property_name$;\n  }\n}\n"
                    );
  return;
}

Assistant:

void PrimitiveOneofFieldGenerator::GenerateMembers(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : $default_value$; }\n"
    "  set {\n");
    if (is_value_type) {
      printer->Print(
        variables_,
        "    $oneof_name$_ = value;\n");
    } else {
      printer->Print(
        variables_,
        "    $oneof_name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n");
    }
    printer->Print(
      variables_,
      "    $oneof_name$Case_ = $oneof_property_name$OneofCase.$property_name$;\n"
      "  }\n"
      "}\n");
}